

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::for_statement::print(for_statement *this,wostream *os)

{
  statement *psVar1;
  long *plVar2;
  expression *peVar3;
  wostream *pwVar4;
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t local_14;
  
  std::operator<<(os,"for_statement{");
  psVar1 = (this->init_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 == (statement *)0x0) {
    std::operator<<(os,"{}");
  }
  else {
    (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x10))(psVar1,os);
  }
  plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    local_1c = (**(code **)(*plVar2 + 0x50))(plVar2,0x2c);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_1c,1);
    peVar3 = (this->cond_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (peVar3 == (expression *)0x0) {
      std::operator<<(os,"{}");
    }
    else {
      (**(code **)((long)(peVar3->super_syntax_node)._vptr_syntax_node + 0x10))(peVar3,os);
    }
    plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      local_18 = (**(code **)(*plVar2 + 0x50))(plVar2,0x2c);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_18,1);
      peVar3 = (this->iter_)._M_t.
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      if (peVar3 == (expression *)0x0) {
        std::operator<<(os,"{}");
      }
      else {
        (**(code **)((long)(peVar3->super_syntax_node)._vptr_syntax_node + 0x10))(peVar3,os);
      }
      plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar2 != (long *)0x0) {
        local_14 = (**(code **)(*plVar2 + 0x50))(plVar2,0x2c);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_14,1);
        psVar1 = (this->s_)._M_t.
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
        (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x10))(psVar1,pwVar4);
        std::operator<<(os,"}");
        return;
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void print(std::wostream& os) const override {
        os << "for_statement{";
        if (init_) os << *init_; else os << "{}";
        os << ',';
        if (cond_) os << *cond_; else os << "{}";
        os << ',';
        if (iter_) os << *iter_; else os << "{}";
        os << ',' << *s_;
        os << "}";
    }